

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void redirect_duplicated_labels
               (MIR_context_t ctx,VARR_MIR_insn_t *labels,VARR_MIR_insn_t *branch_insns)

{
  ulong uVar1;
  size_t sVar2;
  MIR_insn_t_conflict pMVar3;
  anon_union_32_12_57d33f68_for_u *paVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = 1;
LAB_00117008:
  sVar2 = VARR_MIR_insn_tlength(labels);
  if (sVar2 == 0) {
    while (sVar2 = VARR_MIR_insn_tlength((VARR_MIR_insn_t *)ctx), sVar2 != 0) {
      pMVar3 = VARR_MIR_insn_tpop((VARR_MIR_insn_t *)ctx);
      pMVar3->data = (void *)0x0;
    }
    return;
  }
  pMVar3 = VARR_MIR_insn_tpop(labels);
  iVar5 = (int)*(ulong *)&pMVar3->field_0x18;
  uVar6 = 2;
  uVar7 = uVar1;
  if (iVar5 != 0xa5) goto code_r0x00117029;
  goto LAB_0011704f;
code_r0x00117029:
  if (iVar5 != 0xa6) {
    if (iVar5 == 0xaa) {
      uVar6 = *(ulong *)&pMVar3->field_0x18 >> 0x20;
    }
    else {
      uVar6 = uVar1;
      uVar7 = 0;
    }
LAB_0011704f:
    paVar4 = &pMVar3->ops[uVar7].u;
    for (; uVar7 < uVar6; uVar7 = uVar7 + 1) {
      paVar4->i = (int64_t)paVar4->ref->data;
      paVar4 = (anon_union_32_12_57d33f68_for_u *)(&paVar4->i + 6);
    }
  }
  goto LAB_00117008;
}

Assistant:

static void redirect_duplicated_labels (MIR_context_t ctx MIR_UNUSED, VARR (MIR_insn_t) * labels,
                                        VARR (MIR_insn_t) * branch_insns) {
  MIR_insn_t insn;

  while (VARR_LENGTH (MIR_insn_t, branch_insns) != 0) { /* redirect new label operands */
    size_t start_label_nop = 0, bound_label_nop = 1, n;

    insn = VARR_POP (MIR_insn_t, branch_insns);
    if (insn->code == MIR_JMPI) continue;
    if (insn->code == MIR_SWITCH) {
      start_label_nop = 1;
      bound_label_nop = start_label_nop + insn->nops - 1;
    } else if (insn->code == MIR_LADDR) {
      start_label_nop = 1;
      bound_label_nop = 2;
    }
    for (n = start_label_nop; n < bound_label_nop; n++)
      insn->ops[n].u.label = insn->ops[n].u.label->data;
  }
  while (VARR_LENGTH (MIR_insn_t, labels) != 0) { /* reset data */
    insn = VARR_POP (MIR_insn_t, labels);
    insn->data = NULL;
  }
}